

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::exprNotTest(Parser *this)

{
  bool bVar1;
  ExprNode *pEVar2;
  Token notOp;
  Token TStack_78;
  
  Tokenizer::getToken(&TStack_78,this->tokenizer);
  Tokenizer::ungetToken(this->tokenizer);
  bVar1 = Token::isNot(&TStack_78);
  if (bVar1) {
    pEVar2 = exprNotTest(this);
  }
  else {
    pEVar2 = compareExpr(this);
  }
  Token::~Token(&TStack_78);
  return pEVar2;
}

Assistant:

ExprNode *Parser::exprNotTest(){
    Token notOp = tokenizer.getToken();
    tokenizer.ungetToken();
    if(notOp.isNot()){
        ExprNode *notTest = exprNotTest();
        return notTest;
    }else {
        ExprNode *comparison = compareExpr();
        return comparison;
    }
}